

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_server.c
# Opt level: O2

void msocket_server_create
               (msocket_server_t *self,uint8_t addressFamily,_func_void_void_ptr *pDestructor)

{
  if (self != (msocket_server_t *)0x0) {
    self->tcpPort = 0;
    self->udpPort = 0;
    self->acceptSocket = (msocket_t *)0x0;
    self->cleanupStop = '\0';
    self->udpAddr = (char *)0x0;
    self->socketPath = (char *)0x0;
    self->handlerArg = (void *)0x0;
    (self->handlerTable).tcp_accept =
         (_func_void_void_ptr_msocket_server_tag_ptr_msocket_t_ptr *)0x0;
    (self->handlerTable).tcp_inactivity = (_func_void_uint32_t *)0x0;
    (self->handlerTable).udp_msg = (_func_void_void_ptr_char_ptr_uint16_t_uint8_t_ptr_uint32_t *)0x0
    ;
    (self->handlerTable).tcp_connected = (_func_void_void_ptr_char_ptr_uint16_t *)0x0;
    (self->handlerTable).tcp_disconnected = (_func_void_void_ptr *)0x0;
    (self->handlerTable).tcp_data = (_func_int8_t_void_ptr_uint8_t_ptr_uint32_t_uint32_t_ptr *)0x0;
    self->addressFamily = addressFamily;
    if (pDestructor == (_func_void_void_ptr *)0x0) {
      pDestructor = msocket_vdelete;
    }
    self->pDestructor = pDestructor;
    msocket_ary_create(&self->cleanupItems);
    pthread_mutex_init((pthread_mutex_t *)&self->mutex,(pthread_mutexattr_t *)0x0);
    sem_init((sem_t *)&self->sem,0,0);
    return;
  }
  return;
}

Assistant:

void msocket_server_create(msocket_server_t *self, uint8_t addressFamily, void (*pDestructor)(void*)){
   if(self != 0){
      self->tcpPort = 0;
      self->udpPort = 0;
      self->udpAddr=0;
      self->socketPath=0;
      self->acceptSocket = 0;
      self->cleanupStop = 0;
      memset(&self->handlerTable,0,sizeof(self->handlerTable));
      self->handlerArg = 0;
      self->addressFamily = addressFamily;
      if (pDestructor != 0)
      {
         self->pDestructor = pDestructor;
      }
      else
      {
         self->pDestructor = msocket_vdelete;
      }
      msocket_ary_create(&self->cleanupItems,0);
      MUTEX_INIT(self->mutex);
      SEMAPHORE_CREATE(self->sem);
   }
}